

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_Tt8Cnf(word *t,int nVars,int *pCover)

{
  int local_70;
  int local_6c;
  int nCubes;
  int c;
  word tc [4];
  word uRes [4];
  int *pCover_local;
  int nVars_local;
  word *t_local;
  
  _nCubes = *t ^ 0xffffffffffffffff;
  tc[0] = t[1] ^ 0xffffffffffffffff;
  tc[1] = t[2] ^ 0xffffffffffffffff;
  tc[2] = t[3] ^ 0xffffffffffffffff;
  local_70 = 0;
  Abc_Tt8IsopCover(t,t,nVars,tc + 3,pCover,&local_70);
  for (local_6c = 0; local_6c < local_70; local_6c = local_6c + 1) {
    pCover[local_6c] = 1 << ((byte)(nVars << 1) & 0x1f) | pCover[local_6c];
  }
  Abc_Tt8IsopCover((word *)&nCubes,(word *)&nCubes,nVars,tc + 3,pCover,&local_70);
  for (; local_6c < local_70; local_6c = local_6c + 1) {
    pCover[local_6c] = 1 << ((char)(nVars << 1) + 1U & 0x1f) | pCover[local_6c];
  }
  if (local_70 < 0x101) {
    return local_70;
  }
  __assert_fail("nCubes <= 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                ,0xa14,"int Abc_Tt8Cnf(word *, int, int *)");
}

Assistant:

static inline int Abc_Tt8Cnf( word t[4], int nVars, int * pCover )
{
    word uRes[4], tc[4] = {~t[0], ~t[1], ~t[2], ~t[3]};
    int c, nCubes = 0;
    Abc_Tt8IsopCover( t,  t,  nVars, uRes, pCover, &nCubes );
    for ( c = 0; c < nCubes; c++ )
        pCover[c] |= (1 << (2*nVars+0));
    Abc_Tt8IsopCover( tc, tc, nVars, uRes, pCover, &nCubes );
    for ( ; c < nCubes; c++ )
        pCover[c] |= (1 << (2*nVars+1));
    assert( nCubes <= 256 );
    return nCubes;
}